

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

Vec_Vec_t * Vec_VecStart(int nSize)

{
  Vec_Vec_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  int local_1c;
  int i;
  Vec_Vec_t *p;
  int nSize_local;
  
  pVVar1 = Vec_VecAlloc(nSize);
  for (local_1c = 0; local_1c < nSize; local_1c = local_1c + 1) {
    pVVar2 = Vec_PtrAlloc(0);
    pVVar1->pArray[local_1c] = pVVar2;
  }
  pVVar1->nSize = nSize;
  return pVVar1;
}

Assistant:

static inline Vec_Vec_t * Vec_VecStart( int nSize )
{
    Vec_Vec_t * p;
    int i;
    p = Vec_VecAlloc( nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = nSize;
    return p;
}